

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_composition_test.cpp
# Opt level: O2

void __thiscall
CatcherComposition_Tests::CatcherComposition_with_3_catchers_works::test_method
          (CatcherComposition_with_3_catchers_works *this)

{
  GenericExceptionHandler<void,_mittens::GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::bad_alloc>_>,_mittens::DefaultNoAction<std::exception>_>,_mittens::DefaultNoAction<void>_>
  catcher;
  
  mittens::
  std_exception_handler<mittens::GenericExceptionHandler<std::bad_alloc,mittens::UnHandler<int>,mittens::DefaultNoAction<std::bad_alloc>>,int>
            (-2,(GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::bad_alloc>_>
                 )0x10000fffffffd,true);
  throw_bad_alloc();
  throw_std_exception();
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CatcherComposition_with_3_catchers_works)
{
   auto catcher = all_catcher(-1, std_exception_handler(-2, bad_alloc_handler(-3))); // external handler

   try
   {
      throw_bad_alloc();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(-3, catcher.handleException());
   }

   try
   {
      throw_std_exception();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(-2, catcher.handleException());
   }

   try
   {
      throw_int();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(-1, catcher.handleException());
   }
}